

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.h
# Opt level: O3

void __thiscall r_exec::Value::~Value(Value *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class REPLICODE_EXPORT Value:
    public core::_Object
{
protected:
    BindingMap *map;
    Value(BindingMap *map);
public:
    virtual Value *copy(BindingMap *map) const = 0;
    virtual void valuate(r_code::Code *destination, uint16_t write_index, uint16_t &extent_index) const = 0;
    virtual bool match(const r_code::Code *object, uint16_t index) = 0;
    virtual r_code::Atom *get_code() = 0;
    virtual r_code::Code *get_object() = 0;
    virtual uint16_t get_code_size() = 0;

    virtual bool intersect(const Value *v) const
    {
        return false;
    }
    virtual bool _intersect(const AtomValue *v) const
    {
        return false;
    }
    virtual bool _intersect(const StructureValue *v) const
    {
        return false;
    }
    virtual bool _intersect(const ObjectValue *v) const
    {
        return false;
    }

    virtual bool contains(const r_code::Atom a) const
    {
        return false;
    }
    virtual bool contains(const r_code::Atom *s) const
    {
        return false;
    }
    virtual bool contains(const r_code::Code *o) const
    {
        return false;
    }
}